

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::TestCase::matchesTags(TestCase *this,string *tagPattern)

{
  pointer pTVar1;
  bool bVar2;
  pointer this_00;
  bool bVar3;
  TagExpression exp;
  vector<Catch::TagSet,_std::allocator<Catch::TagSet>_> local_88;
  TagParser local_68;
  undefined1 local_60;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>_>_>
  local_58;
  undefined1 *local_28;
  
  local_28 = (undefined1 *)&local_88;
  local_88.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
  super__Vector_impl_data._M_start = (TagSet *)0x0;
  local_88.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
  super__Vector_impl_data._M_finish = (TagSet *)0x0;
  local_88.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_68._vptr_TagParser = (_func_int **)&PTR__TagExpressionParser_00165528;
  local_60 = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  TagParser::parse(&local_68,tagPattern);
  local_68._vptr_TagParser = (_func_int **)&PTR__TagExpressionParser_00165528;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>_>_>
  ::~_Rb_tree(&local_58);
  pTVar1 = local_88.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar3 = local_88.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_88.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
          super__Vector_impl_data._M_finish;
  if (bVar3) {
    this_00 = local_88.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      bVar2 = TagSet::matches(this_00,&(this->super_TestCaseInfo).tags);
      if (bVar2) break;
      this_00 = this_00 + 1;
      bVar3 = this_00 != pTVar1;
    } while (bVar3);
  }
  std::vector<Catch::TagSet,_std::allocator<Catch::TagSet>_>::~vector(&local_88);
  return bVar3;
}

Assistant:

bool TestCase::matchesTags( std::string const& tagPattern ) const {
        TagExpression exp;
        TagExpressionParser( exp ).parse( tagPattern );
        return exp.matches( tags );
    }